

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_server.c
# Opt level: O1

void ssl_write_max_fragment_length_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t *olen)

{
  size_t sVar1;
  
  if (ssl->session_negotiate->mfl_code == '\0') {
    sVar1 = 0;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0x754,"server hello, max_fragment_length extension");
    buf[0] = '\0';
    buf[1] = '\x01';
    buf[2] = '\0';
    buf[3] = '\x01';
    buf[4] = ssl->session_negotiate->mfl_code;
    sVar1 = 5;
  }
  *olen = sVar1;
  return;
}

Assistant:

static void ssl_write_max_fragment_length_ext(mbedtls_ssl_context *ssl,
                                              unsigned char *buf,
                                              size_t *olen)
{
    unsigned char *p = buf;

    if (ssl->session_negotiate->mfl_code == MBEDTLS_SSL_MAX_FRAG_LEN_NONE) {
        *olen = 0;
        return;
    }

    MBEDTLS_SSL_DEBUG_MSG(3, ("server hello, max_fragment_length extension"));

    MBEDTLS_PUT_UINT16_BE(MBEDTLS_TLS_EXT_MAX_FRAGMENT_LENGTH, p, 0);
    p += 2;

    *p++ = 0x00;
    *p++ = 1;

    *p++ = ssl->session_negotiate->mfl_code;

    *olen = 5;
}